

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_DISENCHANT(effect_handler_context_t_conflict *context)

{
  uint32_t *puVar1;
  byte *pbVar2;
  ushort uVar3;
  player_upkeep *ppVar4;
  bool bVar5;
  _Bool _Var6;
  char cVar7;
  uint32_t uVar8;
  object *obj;
  char *pcVar9;
  uint32_t uVar10;
  uint uVar11;
  uint uVar12;
  wchar_t wVar13;
  long lVar14;
  char o_name [80];
  char acStack_78 [80];
  
  uVar3 = (player->body).count;
  uVar10 = 0;
  if (uVar3 != 0) {
    wVar13 = L'\0';
    do {
      _Var6 = slot_type_is(player,wVar13,L'\x03');
      if ((!_Var6) && (_Var6 = slot_type_is(player,wVar13,L'\x04'), !_Var6)) {
        _Var6 = slot_type_is(player,wVar13,L'\x05');
        uVar10 = uVar10 + !_Var6;
      }
      wVar13 = wVar13 + L'\x01';
      uVar3 = (player->body).count;
    } while ((uint)wVar13 < (uint)uVar3);
  }
  uVar11 = (uint)uVar3;
  wVar13 = uVar11 + L'\xffffffff';
  if (uVar11 != 0) {
    do {
      wVar13 = uVar11 + L'\xffffffff';
      _Var6 = slot_type_is(player,wVar13,L'\x03');
      if (((!_Var6) && (_Var6 = slot_type_is(player,wVar13,L'\x04'), !_Var6)) &&
         (_Var6 = slot_type_is(player,wVar13,L'\x05'), !_Var6)) {
        uVar8 = Rand_div(uVar10);
        if (uVar8 == 0) goto LAB_0013cc6d;
        uVar10 = uVar10 - 1;
      }
      uVar12 = uVar11 - 1;
      bVar5 = 0 < (int)uVar11;
      uVar11 = uVar12;
    } while (uVar12 != 0 && bVar5);
    wVar13 = L'\xffffffff';
  }
LAB_0013cc6d:
  context->ident = true;
  obj = slot_object(player,wVar13);
  if (obj == (object *)0x0) {
    return true;
  }
  if (((obj->to_h < 1) && (obj->to_d < 1)) && (obj->to_a < 1)) {
    return true;
  }
  object_desc(acStack_78,0x50,obj,0,player);
  if ((obj->artifact != (artifact *)0x0) && (uVar10 = Rand_div(100), (int)uVar10 < 0x3c)) {
    cVar7 = gear_to_label(player,obj);
    pcVar9 = "";
    if (obj->number == '\x01') {
      pcVar9 = "s";
    }
    msg("Your %s (%c) resist%s disenchantment!",acStack_78,(ulong)(uint)(int)cVar7,pcVar9);
    return true;
  }
  _Var6 = slot_type_is(player,wVar13,L'\x01');
  if ((_Var6) || (_Var6 = slot_type_is(player,wVar13,L'\x02'), _Var6)) {
    if (0 < obj->to_h) {
      obj->to_h = obj->to_h + -1;
    }
    if ((5 < obj->to_h) && (uVar10 = Rand_div(100), (int)uVar10 < 0x14)) {
      obj->to_h = obj->to_h + -1;
    }
    obj->known->to_h = obj->to_h;
    if (0 < obj->to_d) {
      obj->to_d = obj->to_d + -1;
    }
    lVar14 = 0x4a;
    if ((5 < obj->to_d) && (uVar10 = Rand_div(100), (int)uVar10 < 0x14)) {
      obj->to_d = obj->to_d + -1;
    }
  }
  else {
    if (0 < obj->to_a) {
      obj->to_a = obj->to_a + -1;
    }
    if ((5 < obj->to_a) && (uVar10 = Rand_div(100), (int)uVar10 < 0x14)) {
      obj->to_a = obj->to_a + -1;
    }
    lVar14 = 0x46;
  }
  *(undefined2 *)(obj->known->flags + lVar14 + -0x4c) = *(undefined2 *)(obj->flags + lVar14 + -0x4c)
  ;
  cVar7 = gear_to_label(player,obj);
  pcVar9 = "were";
  if (obj->number == '\x01') {
    pcVar9 = "was";
  }
  msg("Your %s (%c) %s disenchanted!",acStack_78,(ulong)(uint)(int)cVar7,pcVar9);
  ppVar4 = player->upkeep;
  puVar1 = &ppVar4->update;
  *puVar1 = *puVar1 | 1;
  pbVar2 = (byte *)((long)&ppVar4->redraw + 2);
  *pbVar2 = *pbVar2 | 4;
  return true;
}

Assistant:

bool effect_handler_DISENCHANT(effect_handler_context_t *context)
{
	int i, count = 0;
	struct object *obj;
	char o_name[80];

	/* Count slots */
	for (i = 0; i < player->body.count; i++) {
		/* Ignore rings, amulets and lights */
		if (slot_type_is(player, i, EQUIP_RING)) continue;
		if (slot_type_is(player, i, EQUIP_AMULET)) continue;
		if (slot_type_is(player, i, EQUIP_LIGHT)) continue;

		/* Count disenchantable slots */
		count++;
	}

	/* Pick one at random */
	for (i = player->body.count - 1; i >= 0; i--) {
		/* Ignore rings, amulets and lights */
		if (slot_type_is(player, i, EQUIP_RING)) continue;
		if (slot_type_is(player, i, EQUIP_AMULET)) continue;
		if (slot_type_is(player, i, EQUIP_LIGHT)) continue;

		if (one_in_(count--)) break;
	}

	/* Notice */
	context->ident = true;

	/* Get the item */
	obj = slot_object(player, i);

	/* No item, nothing happens */
	if (!obj) return true;

	/* Nothing to disenchant */
	if ((obj->to_h <= 0) && (obj->to_d <= 0) && (obj->to_a <= 0))
		return true;

	/* Describe the object */
	object_desc(o_name, sizeof(o_name), obj, ODESC_BASE, player);

	/* Artifacts have a 60% chance to resist */
	if (obj->artifact && (randint0(100) < 60)) {
		/* Message */
		msg("Your %s (%c) resist%s disenchantment!", o_name,
			gear_to_label(player, obj),
			((obj->number != 1) ? "" : "s"));

		return true;
	}

	/* Apply disenchantment, depending on which kind of equipment */
	if (slot_type_is(player, i, EQUIP_WEAPON)
			|| slot_type_is(player, i, EQUIP_BOW)) {
		/* Disenchant to-hit */
		if (obj->to_h > 0) obj->to_h--;
		if ((obj->to_h > 5) && (randint0(100) < 20)) obj->to_h--;
		obj->known->to_h = obj->to_h;

		/* Disenchant to-dam */
		if (obj->to_d > 0) obj->to_d--;
		if ((obj->to_d > 5) && (randint0(100) < 20)) obj->to_d--;
		obj->known->to_d = obj->to_d;
	} else {
		/* Disenchant to-ac */
		if (obj->to_a > 0) obj->to_a--;
		if ((obj->to_a > 5) && (randint0(100) < 20)) obj->to_a--;
		obj->known->to_a = obj->to_a;
	}

	/* Message */
	msg("Your %s (%c) %s disenchanted!", o_name,
		gear_to_label(player, obj),
		((obj->number != 1) ? "were" : "was"));

	/* Recalculate bonuses */
	player->upkeep->update |= (PU_BONUS);

	/* Window stuff */
	player->upkeep->redraw |= (PR_EQUIP);

	return true;
}